

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_stack.c
# Opt level: O1

control_frame * pop_control_stack(control_frame *__return_storage_ptr__,control_stack *s)

{
  undefined7 uVar1;
  control_frame *pcVar2;
  long lVar3;
  control_frame *pcVar4;
  
  pcVar2 = s->sp + -1;
  s->sp = pcVar2;
  s->size = s->size - 1;
  if (s->bp <= pcVar2) {
    pcVar4 = __return_storage_ptr__;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = *(undefined7 *)&pcVar2->field_0x1;
      pcVar4->opcode = pcVar2->opcode;
      *(undefined7 *)&pcVar4->field_0x1 = uVar1;
      pcVar2 = (control_frame *)&pcVar2->instructions;
      pcVar4 = (control_frame *)&pcVar4->instructions;
    }
    return __return_storage_ptr__;
  }
  pop_control_stack_cold_1();
  pcVar2 = (control_frame *)malloc(0xd8);
  memset(pcVar2,0,0xd8);
  initStack((stack *)pcVar2);
  initControlStack((control_stack *)&(pcVar2->block_type).return_count);
  return pcVar2;
}

Assistant:

control_frame pop_control_stack(control_stack *s) {
    s->sp -= 1;
    s->size--;
    if (s->sp < s->bp) {
        errorExit("control_stack overflow\n");
    } else {
        return *s->sp;
    }
}